

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_nwrite(Curl_easy *data,int sockindex,void *buf,size_t blen,ssize_t *pnwritten)

{
  connectdata *conn;
  ssize_t sStack_38;
  CURLcode result;
  ssize_t nwritten;
  ssize_t *pnwritten_local;
  size_t blen_local;
  void *buf_local;
  Curl_easy *pCStack_10;
  int sockindex_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  nwritten = (ssize_t)pnwritten;
  pnwritten_local = (ssize_t *)blen;
  blen_local = (size_t)buf;
  buf_local._4_4_ = sockindex;
  pCStack_10 = data;
  sStack_38 = (*data->conn->send[sockindex])(data,sockindex,buf,blen,(CURLcode *)((long)&conn + 4));
  if (conn._4_4_ == CURLE_AGAIN) {
    sStack_38 = 0;
    conn._4_4_ = CURLE_OK;
  }
  else if (conn._4_4_ != CURLE_OK) {
    sStack_38 = -1;
  }
  *(ssize_t *)nwritten = sStack_38;
  return conn._4_4_;
}

Assistant:

CURLcode Curl_nwrite(struct Curl_easy *data,
                     int sockindex,
                     const void *buf,
                     size_t blen,
                     ssize_t *pnwritten)
{
  ssize_t nwritten;
  CURLcode result = CURLE_OK;
  struct connectdata *conn;

  DEBUGASSERT(sockindex >= 0 && sockindex < 2);
  DEBUGASSERT(pnwritten);
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
#ifdef CURLDEBUG
  {
    /* Allow debug builds to override this logic to force short sends
    */
    char *p = getenv("CURL_SMALLSENDS");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        blen = CURLMIN(blen, altsize);
    }
  }
#endif
  nwritten = conn->send[sockindex](data, sockindex, buf, blen, &result);
  if(result == CURLE_AGAIN) {
    nwritten = 0;
    result = CURLE_OK;
  }
  else if(result) {
    nwritten = -1; /* make sure */
  }
  else {
    DEBUGASSERT(nwritten >= 0);
  }

  *pnwritten = nwritten;
  return result;
}